

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::SGDOptimizer::SharedDtor(SGDOptimizer *this)

{
  if (this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    if (this->learningrate_ != (DoubleParameter *)0x0) {
      (*(this->learningrate_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
      if (this->minibatchsize_ != (Int64Parameter *)0x0) {
        (*(this->minibatchsize_->super_MessageLite)._vptr_MessageLite[1])();
      }
      if ((this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) &&
         (this->momentum_ != (DoubleParameter *)0x0)) {
        (*(this->momentum_->super_MessageLite)._vptr_MessageLite[1])();
        return;
      }
    }
  }
  return;
}

Assistant:

void SGDOptimizer::SharedDtor() {
  if (this != internal_default_instance()) {
    delete learningrate_;
  }
  if (this != internal_default_instance()) {
    delete minibatchsize_;
  }
  if (this != internal_default_instance()) {
    delete momentum_;
  }
}